

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O2

string * __thiscall
cmScriptGenerator::CreateConfigTest
          (string *__return_storage_ptr__,cmScriptGenerator *this,string *config)

{
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  local_40.View_._M_str = (this->RuntimeConfigVariable)._M_dataplus._M_p;
  local_40.View_._M_len = (this->RuntimeConfigVariable)._M_string_length;
  local_70.View_._M_len = 0xc;
  local_70.View_._M_str = " MATCHES \"^(";
  cmStrCat<>(__return_storage_ptr__,&local_40,&local_70);
  if (config->_M_string_length != 0) {
    cmScriptGeneratorEncodeConfig(config,__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmScriptGenerator::CreateConfigTest(const std::string& config)
{
  std::string result = cmStrCat(this->RuntimeConfigVariable, " MATCHES \"^(");
  if (!config.empty()) {
    cmScriptGeneratorEncodeConfig(config, result);
  }
  result += ")$\"";
  return result;
}